

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O0

void bov_points_draw_with_order_aux
               (bov_window_t *window,bov_points_t *points,bov_points_drawing_mode_t mode,
               bov_order_t *order,GLint start,GLsizei count)

{
  GLenum GVar1;
  GLsizei local_30;
  GLenum primitive;
  GLsizei count_local;
  GLint start_local;
  bov_order_t *order_local;
  bov_points_drawing_mode_t mode_local;
  bov_points_t *points_local;
  bov_window_t *window_local;
  
  if (order == (bov_order_t *)0x0) {
    bov_points_draw_aux(window,points,mode,start,count);
  }
  else if ((points->vboLen != 0) && (start < order->eboLen)) {
    if ((order->eboLen < count + start) || (local_30 = count, start + count < count)) {
      local_30 = order->eboLen - start;
    }
    GVar1 = switch_rasterizer_with_mode(window,points,mode);
    (*glad_glBindBuffer)(0x8893,order->ebo);
    (*glad_glDrawElements)(GVar1,local_30,0x1405,(void *)((long)start << 2));
  }
  return;
}

Assistant:

void bov_points_draw_with_order_aux(bov_window_t* window,
                                    const bov_points_t* points,
                                    bov_points_drawing_mode_t mode,
                                    const bov_order_t* order,
                                    GLint start, GLsizei count)
{
	if (order == NULL) {
		bov_points_draw_aux(window, points, mode, start, count);
		return;
	}

	if(points->vboLen==0 || start>=order->eboLen)
		return;

	if(count + start > order->eboLen || start + count < count) { //< don't forget to detect overflow
		count = order->eboLen - start;
	}

	GLenum primitive = switch_rasterizer_with_mode(window, points, mode);

	glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, order->ebo);
	glDrawElements(primitive, count, GL_UNSIGNED_INT,
	               (void*) (start * sizeof(GLuint)));
	// glBindVertexArray(0);
}